

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash.c
# Opt level: O0

ion_err_t oafh_initialize(ion_file_hashmap_t *hashmap,
                         _func_ion_hash_t_ion_file_hashmap_t_ptr_ion_key_t_int *hashing_function,
                         ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size
                         ,int size,ion_dictionary_id_t id)

{
  int iVar1;
  FILE *pFVar2;
  undefined1 *__ptr;
  size_t sVar3;
  size_t sVar4;
  int local_54;
  int local_50;
  int writes;
  int i;
  int record_size;
  ion_hash_bucket_t *file_record;
  int actual_filename_length;
  char addr_filename [12];
  int size_local;
  ion_value_size_t value_size_local;
  ion_key_size_t key_size_local;
  ion_key_type_t key_type_local;
  _func_ion_hash_t_ion_file_hashmap_t_ptr_ion_key_t_int *hashing_function_local;
  ion_file_hashmap_t *hashmap_local;
  
  hashmap->write_concern = '\x01';
  (hashmap->super).record.key_size = key_size;
  (hashmap->super).record.value_size = value_size;
  (hashmap->super).key_type = key_type;
  hashmap->map_size = size;
  hashmap->compute_hash = (_func_int_ion_file_hashmap_t_ptr_ion_key_t_int *)hashing_function;
  addr_filename._4_4_ = size;
  addr_filename._8_4_ = value_size;
  file_record._0_4_ = dictionary_get_filename(id,"oaf",(char *)((long)&file_record + 4));
  if ((int)file_record < 0xc) {
    pFVar2 = fopen((char *)((long)&file_record + 4),"r+b");
    hashmap->file = (FILE *)pFVar2;
    if (hashmap->file == (FILE *)0x0) {
      pFVar2 = fopen((char *)((long)&file_record + 4),"w+b");
      hashmap->file = (FILE *)pFVar2;
      iVar1 = (hashmap->super).record.key_size + 1 + (hashmap->super).record.value_size;
      __ptr = (undefined1 *)calloc((long)iVar1,1);
      *__ptr = 0xff;
      local_54 = 0;
      for (local_50 = 0; local_50 < hashmap->map_size; local_50 = local_50 + 1) {
        sVar3 = fwrite(__ptr,1,1,(FILE *)hashmap->file);
        sVar4 = fwrite(__ptr + 1,(long)(iVar1 + -1),1,(FILE *)hashmap->file);
        local_54 = local_54 + (int)sVar3 + (int)sVar4;
      }
      fflush((FILE *)hashmap->file);
      if (local_54 / 2 == hashmap->map_size) {
        free(__ptr);
        hashmap_local._7_1_ = '\0';
      }
      else {
        fclose((FILE *)hashmap->file);
        hashmap_local._7_1_ = '\a';
      }
    }
    else {
      hashmap_local._7_1_ = '\0';
    }
  }
  else {
    hashmap_local._7_1_ = '\x12';
  }
  return hashmap_local._7_1_;
}

Assistant:

ion_err_t
oafh_initialize(
	ion_file_hashmap_t *hashmap,
	ion_hash_t (*hashing_function)(ion_file_hashmap_t *, ion_key_t, int),
	ion_key_type_t key_type,
	ion_key_size_t key_size,
	ion_value_size_t value_size,
	int size,
	ion_dictionary_id_t id
) {
	hashmap->write_concern				= wc_insert_unique;			/* By default allow unique inserts only */
	hashmap->super.record.key_size		= key_size;
	hashmap->super.record.value_size	= value_size;
	hashmap->super.key_type				= key_type;

	/* The hash map is allocated as a single contiguous file*/
	hashmap->map_size					= size;

	hashmap->compute_hash				= (*hashing_function);	/* Allows for binding of different hash functions
																depending on requirements */

	char addr_filename[ION_MAX_FILENAME_LENGTH];

	/* open the file */
	int actual_filename_length = dictionary_get_filename(id, "oaf", addr_filename);

	if (actual_filename_length >= ION_MAX_FILENAME_LENGTH) {
		return err_uninitialized;
	}

	hashmap->file = fopen(addr_filename, "r+b");

	if (NULL != hashmap->file) {
		return err_ok;
	}

	/* open the file */
	hashmap->file = fopen(addr_filename, "w+b");

	ion_hash_bucket_t *file_record;

	int record_size = SIZEOF(STATUS) + hashmap->super.record.key_size + hashmap->super.record.value_size;

	file_record			= calloc(record_size, 1);
	file_record->status = ION_EMPTY;

	/* write out the records to disk to prep */
#if ION_DEBUG
	printf("Initializing hash table\n");
#endif

	int i, writes = 0;

	for (i = 0; i < hashmap->map_size; i++) {
		writes	+= fwrite(&file_record->status, SIZEOF(STATUS), 1, hashmap->file);
		writes	+= fwrite(file_record->data, record_size - SIZEOF(STATUS), 1, hashmap->file);
	}

	fflush(hashmap->file);

	if (writes / 2 != hashmap->map_size) {
		fclose(hashmap->file);
		return err_file_write_error;
	}

	free(file_record);

	return err_ok;
}